

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

void __thiscall
google::protobuf::StringPiece::StringPiece
          (StringPiece *this,StringPiece x,stringpiece_ssize_type pos,stringpiece_ssize_type len)

{
  long *plVar1;
  LogMessage *pLVar2;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  long local_38;
  stringpiece_ssize_type local_30;
  stringpiece_ssize_type len_local;
  stringpiece_ssize_type pos_local;
  StringPiece *this_local;
  StringPiece x_local;
  
  x_local.ptr_ = (char *)x.length_;
  this_local = (StringPiece *)x.ptr_;
  this->ptr_ = (char *)((long)&this_local->ptr_ + pos);
  local_38 = (long)x_local.ptr_ - pos;
  local_30 = len;
  len_local = pos;
  pos_local = (stringpiece_ssize_type)this;
  plVar1 = std::min<long>(&local_30,&local_38);
  this->length_ = *plVar1;
  local_71 = 0;
  if (len_local < 0) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x3c);
    local_71 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_70,"CHECK failed: (0) <= (pos): ");
    internal::LogFinisher::operator=(local_85,pLVar2);
  }
  if ((local_71 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_70);
  }
  local_c1 = 0;
  if ((long)x_local.ptr_ < len_local) {
    internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x3d);
    local_c1 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_c0,"CHECK failed: (pos) <= (x.length_): ");
    internal::LogFinisher::operator=(&local_c2,pLVar2);
  }
  if ((local_c1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_c0);
  }
  local_101 = 0;
  if (local_30 < 0) {
    internal::LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x3e);
    local_101 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_100,"CHECK failed: (len) >= (0): ");
    internal::LogFinisher::operator=(&local_102,pLVar2);
  }
  if ((local_101 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_100);
  }
  return;
}

Assistant:

StringPiece::StringPiece(StringPiece x,
                         stringpiece_ssize_type pos,
                         stringpiece_ssize_type len)
    : ptr_(x.ptr_ + pos), length_(std::min(len, x.length_ - pos)) {
  GOOGLE_DCHECK_LE(0, pos);
  GOOGLE_DCHECK_LE(pos, x.length_);
  GOOGLE_DCHECK_GE(len, 0);
}